

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O0

HTTP_HEADERS_HANDLE
createIotHubRequestHttpHeaders(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *upload_data)

{
  IOTHUB_AUTHORIZATION_HANDLE handle;
  bool bVar1;
  HTTP_HEADERS_RESULT HVar2;
  LOGGER_LOG p_Var3;
  STRING_HANDLE handle_00;
  time_t __time1;
  ulong uVar4;
  char *pcVar5;
  double dVar6;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  char *sas_token;
  uint64_t expiry;
  LOGGER_LOG l_5;
  time_t curr_time;
  LOGGER_LOG l_4;
  STRING_HANDLE uri_resource;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  _Bool isError;
  LOGGER_LOG l;
  HTTP_HEADERS_HANDLE iotHubRequestHttpHeaders;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *upload_data_local;
  
  l = (LOGGER_LOG)HTTPHeaders_Alloc();
  if ((HTTP_HEADERS_HANDLE)l == (HTTP_HEADERS_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"createIotHubRequestHttpHeaders",0x11b,1,
                "Failed to allocate HTTP headers for IoT Hub connection");
    }
  }
  else {
    HVar2 = HTTPHeaders_AddHeaderNameValuePair
                      ((HTTP_HEADERS_HANDLE)l,"Content-Type","application/json");
    if (((HVar2 == HTTP_HEADERS_OK) &&
        (HVar2 = HTTPHeaders_AddHeaderNameValuePair
                           ((HTTP_HEADERS_HANDLE)l,"Accept","application/json"),
        HVar2 == HTTP_HEADERS_OK)) &&
       (HVar2 = HTTPHeaders_AddHeaderNameValuePair
                          ((HTTP_HEADERS_HANDLE)l,"User-Agent","iothubclient/1.15.0"),
       HVar2 == HTTP_HEADERS_OK)) {
      switch(upload_data->cred_type) {
      case IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY:
        HVar2 = HTTPHeaders_AddHeaderNameValuePair((HTTP_HEADERS_HANDLE)l,"Authorization","");
        if (HVar2 == HTTP_HEADERS_OK) {
          bVar1 = false;
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"createIotHubRequestHttpHeaders",0x140,1,"unable to add authorization header"
                     );
          }
          bVar1 = true;
        }
        break;
      case IOTHUB_CREDENTIAL_TYPE_X509:
      case IOTHUB_CREDENTIAL_TYPE_X509_ECC:
        bVar1 = false;
        break;
      case IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN:
        HVar2 = HTTPHeaders_AddHeaderNameValuePair
                          ((HTTP_HEADERS_HANDLE)l,"Authorization",
                           (upload_data->credentials).x509_credentials.x509certificate);
        if (HVar2 == HTTP_HEADERS_OK) {
          bVar1 = false;
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"createIotHubRequestHttpHeaders",0x17d,1,"unable to add authorization header"
                     );
          }
          bVar1 = true;
        }
        break;
      case IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH:
        handle_00 = STRING_construct_sprintf
                              ("%s/devices/%s",upload_data->hostname,upload_data->deviceId);
        if (handle_00 == (STRING_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"createIotHubRequestHttpHeaders",0x14f,1,"Failure constructing uri string");
          }
          bVar1 = true;
        }
        else {
          __time1 = get_time((time_t *)0x0);
          if (__time1 == -1) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                        ,"createIotHubRequestHttpHeaders",0x157,1,"failure retrieving time");
            }
            bVar1 = true;
          }
          else {
            dVar6 = difftime(__time1,0);
            uVar4 = (ulong)(dVar6 + 3600.0);
            handle = upload_data->authorization_module;
            pcVar5 = STRING_c_str(handle_00);
            pcVar5 = IoTHubClient_Auth_Get_SasToken
                               (handle,pcVar5,
                                uVar4 | (long)((dVar6 + 3600.0) - 9.223372036854776e+18) &
                                        (long)uVar4 >> 0x3f,"");
            if (pcVar5 == (char *)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                          ,"createIotHubRequestHttpHeaders",0x161,1,"unable to retrieve sas token");
              }
              bVar1 = true;
            }
            else {
              HVar2 = HTTPHeaders_AddHeaderNameValuePair
                                ((HTTP_HEADERS_HANDLE)l,"Authorization",pcVar5);
              if (HVar2 == HTTP_HEADERS_OK) {
                bVar1 = false;
              }
              else {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                            ,"createIotHubRequestHttpHeaders",0x168,1,
                            "unable to HTTPHeaders_AddHeaderNameValuePair");
                }
                bVar1 = true;
              }
              free(pcVar5);
            }
          }
          STRING_delete(handle_00);
        }
        break;
      default:
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"createIotHubRequestHttpHeaders",0x12e,1,
                    "Internal Error: unexpected value in auth schema = %d",upload_data->cred_type);
        }
        bVar1 = true;
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                  ,"createIotHubRequestHttpHeaders",0x125,1,"unable to add HTTP headers");
      }
      bVar1 = true;
    }
    if (bVar1) {
      HTTPHeaders_Free((HTTP_HEADERS_HANDLE)l);
      l = (LOGGER_LOG)0x0;
    }
  }
  return (HTTP_HEADERS_HANDLE)l;
}

Assistant:

static HTTP_HEADERS_HANDLE createIotHubRequestHttpHeaders(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_data)
{
    HTTP_HEADERS_HANDLE iotHubRequestHttpHeaders;

    if ((iotHubRequestHttpHeaders = HTTPHeaders_Alloc()) == NULL)
    {
        LogError("Failed to allocate HTTP headers for IoT Hub connection");
    }
    else
    {
        bool isError;

        if ((HTTPHeaders_AddHeaderNameValuePair(iotHubRequestHttpHeaders, "Content-Type", HEADER_APP_JSON) != HTTP_HEADERS_OK) ||
            (HTTPHeaders_AddHeaderNameValuePair(iotHubRequestHttpHeaders, "Accept", HEADER_APP_JSON) != HTTP_HEADERS_OK) ||
            (HTTPHeaders_AddHeaderNameValuePair(iotHubRequestHttpHeaders, "User-Agent", "iothubclient/" IOTHUB_SDK_VERSION) != HTTP_HEADERS_OK))
        {
            LogError("unable to add HTTP headers");
            isError = true;
        }
        else
        {
            switch (upload_data->cred_type)
            {
                default:
                {
                    LogError("Internal Error: unexpected value in auth schema = %d", upload_data->cred_type);
                    isError = true;
                    break;
                }
                case IOTHUB_CREDENTIAL_TYPE_X509_ECC:
                case IOTHUB_CREDENTIAL_TYPE_X509:
                {
                    isError = false;
                    break;
                }
                case IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY:
                {
                    // This is the scenario that uses `send_http_sas_request`.
                    // Believe it or not, HTTPAPIEX_SAS_ExecuteRequest requires the headers to have
                    // an empty Authorization header so it can replace it with the authorization value. 

                    if (HTTPHeaders_AddHeaderNameValuePair(iotHubRequestHttpHeaders, HEADER_AUTHORIZATION, EMPTY_STRING) != HTTP_HEADERS_OK)
                    {
                        LogError("unable to add authorization header");
                        isError = true;
                    }
                    else
                    {
                        isError = false;
                    }
                    break;
                }
                case IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH:
                {
                    STRING_HANDLE uri_resource = STRING_construct_sprintf("%s/devices/%s", upload_data->hostname, upload_data->deviceId);

                    if (uri_resource == NULL)
                    {
                        LogError("Failure constructing uri string");
                        isError = true;
                    }
                    else
                    {
                        time_t curr_time;
                        if ((curr_time = get_time(NULL)) == INDEFINITE_TIME)
                        {
                            LogError("failure retrieving time");
                            isError = true;
                        }
                        else
                        {
                            uint64_t expiry = (uint64_t)(difftime(curr_time, 0) + 3600);
                            char* sas_token = IoTHubClient_Auth_Get_SasToken(upload_data->authorization_module, STRING_c_str(uri_resource), expiry, EMPTY_STRING);

                            if (sas_token == NULL)
                            {
                                LogError("unable to retrieve sas token");
                                isError = true;
                            }
                            else
                            {
                                if (HTTPHeaders_AddHeaderNameValuePair(iotHubRequestHttpHeaders, HEADER_AUTHORIZATION, sas_token) != HTTP_HEADERS_OK)
                                {
                                    LogError("unable to HTTPHeaders_AddHeaderNameValuePair");
                                    isError = true;
                                }
                                else
                                {
                                    isError = false;
                                }

                                free(sas_token);
                            }
                        }

                        STRING_delete(uri_resource);
                    }

                    break;
                }
                case IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN:
                {
                    if (HTTPHeaders_AddHeaderNameValuePair(iotHubRequestHttpHeaders, HEADER_AUTHORIZATION, upload_data->credentials.supplied_sas_token) != HTTP_HEADERS_OK)
                    {
                        LogError("unable to add authorization header");
                        isError = true;
                    }
                    else
                    {
                        isError = false;
                    }
                    break;
                }
            }
        }

        if (isError)
        {
            HTTPHeaders_Free(iotHubRequestHttpHeaders);
            iotHubRequestHttpHeaders = NULL;
        }
    }

    return iotHubRequestHttpHeaders;
}